

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O0

bool absl::lts_20240722::StrContainsIgnoreCase(string_view haystack,string_view needle)

{
  string_view prefix;
  string_view text;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  undefined1 local_30 [8];
  string_view needle_local;
  string_view haystack_local;
  
  needle_local._M_len = (size_t)needle._M_str;
  local_30 = (undefined1  [8])needle._M_len;
  needle_local._M_str = (char *)haystack._M_len;
  while( true ) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&needle_local._M_str);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    if (sVar2 < sVar3) {
      return false;
    }
    text._M_str = haystack._M_str;
    text._M_len = (size_t)needle_local._M_str;
    prefix._M_str = (char *)needle_local._M_len;
    prefix._M_len = (size_t)local_30;
    bVar1 = StartsWithIgnoreCase(text,prefix);
    if (bVar1) break;
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&needle_local._M_str,1);
  }
  return true;
}

Assistant:

bool StrContainsIgnoreCase(absl::string_view haystack,
                           absl::string_view needle) noexcept {
  while (haystack.size() >= needle.size()) {
    if (StartsWithIgnoreCase(haystack, needle)) return true;
    haystack.remove_prefix(1);
  }
  return false;
}